

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

void PrintBuiltInType(FLispString *out,EZCCBuiltinType type)

{
  int iVar1;
  char buf [30];
  
  if (ZCC_UserType < type) {
    iVar1 = mysnprintf(buf,0x1e,"bad-type-%u");
    FLispString::Add(out,buf,(long)iVar1);
    return;
  }
  FLispString::Add(out,_ZL16BuiltInTypeNames_rel +
                       *(int *)(_ZL16BuiltInTypeNames_rel + (ulong)type * 4));
  return;
}

Assistant:

static void PrintBuiltInType(FLispString &out, EZCCBuiltinType type)
{
	assert(ZCC_NUM_BUILT_IN_TYPES == countof(BuiltInTypeNames));
	if (unsigned(type) >= unsigned(ZCC_NUM_BUILT_IN_TYPES))
	{
		char buf[30];
		size_t len = mysnprintf(buf, countof(buf), "bad-type-%u", type);
		out.Add(buf, len);
	}
	else
	{
		out.Add(BuiltInTypeNames[type]);
	}
}